

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O3

get_result * __thiscall
unodb::
db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::get_internal(get_result *__return_storage_ptr__,
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *this,art_key_type k)

{
  byte bVar1;
  node_type nVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  size_t __n;
  ulong uVar7;
  basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *this_00;
  uint *puVar8;
  ulong uVar9;
  ulong uVar10;
  void *__src;
  find_result fVar11;
  uint64_t local_40;
  get_result *local_38;
  
  uVar6 = k.field_0._8_8_;
  uVar7 = (this->root).tagged_ptr;
  local_38 = __return_storage_ptr__;
  if (uVar7 == 0) {
    bVar3 = false;
  }
  else {
    nVar2 = (node_type)uVar7;
    uVar10 = uVar6;
    __src = k.field_0._0_8_;
    while ((uVar7 & 7) != 0) {
      this_00 = (basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                 *)(uVar7 & 0xfffffffffffffff8);
      bVar1 = *(byte *)((long)&this_00->k_prefix + 7);
      if (7 < bVar1) {
        __assert_fail("result <= key_prefix_capacity",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                      ,0x298,
                      "key_prefix_size unodb::detail::key_prefix<unodb::detail::basic_art_key<std::span<const std::byte>>, unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::critical_section_policy>::length() const [ArtKey = unodb::detail::basic_art_key<std::span<const std::byte>>, CriticalSectionPolicy = unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::critical_section_policy]"
                     );
      }
      local_40 = 0;
      __n = 8;
      if (uVar10 < 8) {
        __n = uVar10;
      }
      memcpy(&local_40,__src,__n);
      uVar4 = detail::
              key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
              ::get_shared_length((key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                                   *)this_00,local_40);
      if (uVar4 < bVar1) goto LAB_0012bc6b;
      uVar9 = (ulong)bVar1;
      if (uVar10 < uVar9) {
LAB_0012bc8a:
        __assert_fail("num_bytes <= key.size_bytes()",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                      ,0xc0,
                      "void unodb::detail::basic_art_key<std::span<const std::byte>>::shift_right(const std::size_t) [KeyType = std::span<const std::byte>]"
                     );
      }
      fVar11 = detail::
               basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
               ::find_child(this_00,nVar2 & (I256|I48),*(byte *)((long)__src + uVar9));
      if (fVar11.second ==
          (in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_> *)
          0x0) goto LAB_0012bc6b;
      if (uVar10 == uVar9) goto LAB_0012bc8a;
      uVar7 = ((fVar11.second)->value).tagged_ptr;
      uVar10 = uVar10 + ~uVar9;
      __src = (void *)((long)__src + uVar9 + 1);
      nVar2 = (node_type)uVar7;
    }
    puVar8 = (uint *)(uVar7 & 0xfffffffffffffff8);
    uVar10 = (ulong)*puVar8;
    uVar7 = uVar10;
    if (uVar6 <= uVar10) {
      uVar7 = uVar6;
    }
    iVar5 = bcmp(k.field_0._0_8_,puVar8 + 2,uVar7);
    if (iVar5 == 0 && uVar10 == uVar6) {
      uVar4 = puVar8[1];
      (local_38->
      super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>).
      _M_payload.super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>.
      _M_payload._M_value._M_ptr = (pointer)((long)(puVar8 + 2) + uVar6);
      *(ulong *)((long)&(local_38->
                        super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>
                        )._M_payload.
                        super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>
                        ._M_payload + 8) = (ulong)uVar4;
      bVar3 = true;
    }
    else {
LAB_0012bc6b:
      bVar3 = false;
    }
  }
  (local_38->super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>).
  _M_payload.super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>.
  _M_engaged = bVar3;
  return local_38;
}

Assistant:

typename db<Key, Value>::get_result db<Key, Value>::get_internal(
    art_key_type k) const noexcept {
  if (UNODB_DETAIL_UNLIKELY(root == nullptr)) return {};

  auto node{root};
  auto remaining_key{k};

  while (true) {
    const auto node_type = node.type();
    if (node_type == node_type::LEAF) {
      const auto* const leaf{node.template ptr<leaf_type*>()};
      if (leaf->matches(k)) return leaf->get_value_view();
      return {};
    }

    UNODB_DETAIL_ASSERT(node_type != node_type::LEAF);

    auto* const inode{node.template ptr<inode_type*>()};
    const auto& key_prefix{inode->get_key_prefix()};
    const auto key_prefix_length{key_prefix.length()};
    if (key_prefix.get_shared_length(remaining_key) < key_prefix_length)
      return {};
    remaining_key.shift_right(key_prefix_length);
    const auto* const child{
        inode->find_child(node_type, remaining_key[0]).second};
    if (child == nullptr) return {};

    node = *child;
    remaining_key.shift_right(1);
  }
}